

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

int buffer_get(void *data)

{
  byte bVar1;
  buffer_data_t *stream;
  char c;
  void *data_local;
  
  if (*(ulong *)((long)data + 0x10) < *(ulong *)((long)data + 8)) {
    bVar1 = *(byte *)(*data + *(long *)((long)data + 0x10));
    *(long *)((long)data + 0x10) = *(long *)((long)data + 0x10) + 1;
    data_local._4_4_ = (uint)bVar1;
  }
  else {
    data_local._4_4_ = 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

static int buffer_get(void *data) {
    char c;
    buffer_data_t *stream = data;
    if (stream->pos >= stream->len)
        return EOF;

    c = stream->data[stream->pos];
    stream->pos++;
    return (unsigned char) c;
}